

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::replace(QString *this,QLatin1StringView before,QString *after,CaseSensitivity cs)

{
  char16_t *after_00;
  QChar before_00;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> b;
  undefined1 local_250 [536];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((before.m_size == 1) && ((after->d).size == 1)) {
    before_00.ucs._1_1_ = 0;
    before_00.ucs._0_1_ = *before.m_data;
    replace(this,before_00,(QChar)*(after->d).ptr,cs);
  }
  else {
    memset((QVarLengthArray<char16_t,_256LL> *)local_250,0xaa,0x218);
    qt_from_latin1_to_qvla((QVarLengthArray<char16_t,_256LL> *)local_250,before);
    after_00 = (after->d).ptr;
    if ((QChar *)after_00 == (QChar *)0x0) {
      after_00 = L"";
    }
    replace(this,(QChar *)local_250._16_8_,before.m_size,(QChar *)after_00,(after->d).size,cs);
    if ((QChar *)local_250._16_8_ != (QChar *)(local_250 + 0x18)) {
      QtPrivate::sizedFree((void *)local_250._16_8_,local_250._0_8_ * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(QLatin1StringView before, const QString &after, Qt::CaseSensitivity cs)
{
    const qsizetype blen = before.size();
    if (blen == 1 && after.size() == 1)
        return replace(before.front(), after.front(), cs);

    QVarLengthArray<char16_t> b = qt_from_latin1_to_qvla(before);
    return replace((const QChar *)b.data(), blen, after.constData(), after.d.size, cs);
}